

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int fits_set_quantize_level(fitsfile *fptr,float qlevel,int *status)

{
  int *status_local;
  float qlevel_local;
  fitsfile *fptr_local;
  
  if ((qlevel != 0.0) || (NAN(qlevel))) {
    fptr->Fptr->request_quantize_level = qlevel;
  }
  else {
    fptr->Fptr->request_quantize_level = 9999.0;
  }
  return *status;
}

Assistant:

int fits_set_quantize_level(fitsfile *fptr,  /* I - FITS file pointer   */
           float qlevel,        /* floating point quantization level      */
           int *status)         /* IO - error status                */
{
/*
   This routine specifies the value of the quantization level, q,  that
   should be used when compressing floating point images.  The image is
   divided into tiles, and each tile is compressed and stored in a row
   of at variable length binary table column.
*/
    if (qlevel == 0.)
    {
        /* this means don't quantize the floating point values. Instead, */
	/* the floating point values will be losslessly compressed */
       (fptr->Fptr)->request_quantize_level = NO_QUANTIZE;
    } else {

        (fptr->Fptr)->request_quantize_level = qlevel;
    }

    return(*status);
}